

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::
pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
::append_realloc(pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                 *this,size_type n,ImplicationList *x)

{
  pointer __src;
  size_type sVar1;
  size_type sVar2;
  ImplicationList *pIVar3;
  int in_ESI;
  pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
  *in_RDI;
  pointer temp;
  size_type new_cap;
  void *in_stack_ffffffffffffffb0;
  ImplicationList *x_00;
  size_type in_stack_ffffffffffffffb8;
  ImplicationList *last;
  ImplicationList *in_stack_ffffffffffffffc0;
  
  sVar1 = grow_size((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                     *)in_stack_ffffffffffffffc0,(size_type)(in_stack_ffffffffffffffb8 >> 0x20));
  pIVar3 = __gnu_cxx::new_allocator<Clasp::ShortImplicationsGraph::ImplicationList>::allocate
                     ((new_allocator<Clasp::ShortImplicationsGraph::ImplicationList> *)
                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  if ((in_RDI->ebo_).buf != (pointer)0x0) {
    __src = (in_RDI->ebo_).buf;
    in_stack_ffffffffffffffc0 = pIVar3;
    sVar2 = size(in_RDI);
    memcpy(in_stack_ffffffffffffffc0,__src,(ulong)sVar2 << 6);
  }
  sVar2 = size(in_RDI);
  last = pIVar3 + sVar2;
  x_00 = pIVar3;
  size(in_RDI);
  detail::fill<Clasp::ShortImplicationsGraph::ImplicationList>(in_stack_ffffffffffffffc0,last,x_00);
  ebo::release((ebo *)x_00);
  (in_RDI->ebo_).buf = pIVar3;
  (in_RDI->ebo_).cap = sVar1;
  (in_RDI->ebo_).size = in_ESI + (in_RDI->ebo_).size;
  return;
}

Assistant:

void append_realloc(size_type n, const T& x) {
		size_type new_cap = grow_size(n);
		pointer temp      = ebo_.allocate(new_cap);
		if (ebo_.buf) {
			std::memcpy(temp, ebo_.buf, size()*sizeof(T));
		}
		detail::fill(temp+size(), temp+size()+n, x);
		ebo_.release();
		ebo_.buf  = temp;
		ebo_.cap  = new_cap;
		ebo_.size+= n;
	}